

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.h
# Opt level: O2

GarbageCollectedBase * __thiscall
HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
::at(HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
     *this,LinkedNode *k)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->map_)._M_h._M_before_begin;
  do {
    p_Var1 = p_Var1->_M_nxt;
    if (p_Var1 == (__node_base *)0x0) {
      return (GarbageCollectedBase *)0x0;
    }
  } while ((LinkedNode *)(p_Var1[1]._M_nxt)->_M_nxt != k);
  return (GarbageCollectedBase *)
         (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)->_M_nxt;
}

Assistant:

GarbageCollectedBase *at(Key *k) {
    for (auto it = map_.begin(); it != map_.end(); it++) {
      if (it->first->GetRaw() == k) {
        return it->second->GetRaw();
      }
    }
    return nullptr;
  }